

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O3

OPJ_BOOL opj_sparse_array_int32_read_or_write
                   (opj_sparse_array_int32_t *sa,OPJ_UINT32 x0,OPJ_UINT32 y0,OPJ_UINT32 x1,
                   OPJ_UINT32 y1,OPJ_INT32 *buf,OPJ_UINT32 buf_col_stride,OPJ_UINT32 buf_line_stride
                   ,OPJ_BOOL forgiving,OPJ_BOOL is_read_op)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  OPJ_INT32 *pOVar8;
  OPJ_INT32 *pOVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  OPJ_UINT32 OVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  OPJ_UINT32 OVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint local_9c;
  
  if (((((x1 <= sa->width) && (x0 < x1)) && (x0 < sa->width)) && ((y1 <= sa->height && (y0 < y1))))
     && (y0 < sa->height)) {
    uVar1 = sa->block_width;
    uVar10 = (ulong)uVar1;
    local_9c = y0 / sa->block_height;
    uVar7 = (ulong)buf_line_stride;
    OVar17 = y0;
    do {
      uVar20 = sa->block_height;
      uVar6 = uVar20;
      if (OVar17 - y0 == 0) {
        uVar6 = uVar20 - y0 % uVar20;
      }
      uVar2 = y1 - OVar17;
      if (uVar6 < y1 - OVar17) {
        uVar2 = uVar6;
      }
      lVar19 = (uVar20 - uVar6) * uVar10;
      lVar11 = (OVar17 - y0) * uVar7;
      uVar20 = x0 / uVar1;
      OVar13 = x0;
      do {
        uVar18 = OVar13 - x0;
        uVar6 = uVar1;
        if (uVar18 == 0) {
          uVar6 = uVar1 - x0 % uVar1;
        }
        uVar3 = x1 - OVar13;
        if (uVar6 < x1 - OVar13) {
          uVar3 = uVar6;
        }
        uVar15 = (ulong)uVar3;
        pOVar8 = sa->data_blocks[sa->block_count_hor * local_9c + uVar20];
        if (is_read_op == 0) {
          if (pOVar8 == (OPJ_INT32 *)0x0) {
            pOVar8 = (OPJ_INT32 *)opj_calloc(1,(ulong)(sa->block_height * sa->block_width) << 2);
            if (pOVar8 == (OPJ_INT32 *)0x0) {
              return 0;
            }
            sa->data_blocks[sa->block_count_hor * local_9c + uVar20] = pOVar8;
          }
          pOVar8 = pOVar8 + lVar19 + (ulong)(uVar1 - uVar6);
          if (buf_col_stride == 1) {
            pOVar9 = buf + lVar11 + (ulong)uVar18;
            uVar6 = uVar2;
            if (uVar3 == 4) {
              for (; uVar6 != 0; uVar6 = uVar6 - 1) {
                uVar5 = *(undefined8 *)(pOVar9 + 2);
                *(undefined8 *)pOVar8 = *(undefined8 *)pOVar9;
                *(undefined8 *)(pOVar8 + 2) = uVar5;
                pOVar9 = pOVar9 + uVar7;
                pOVar8 = pOVar8 + uVar10;
              }
            }
            else if (uVar2 != 0) {
              do {
                memcpy(pOVar8,pOVar9,uVar15 << 2);
                pOVar9 = pOVar9 + uVar7;
                pOVar8 = pOVar8 + uVar10;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
          }
          else {
            pOVar9 = buf + lVar11 + (ulong)(uVar18 * buf_col_stride);
            uVar6 = uVar2;
            if (uVar3 == 1) {
              for (; uVar6 != 0; uVar6 = uVar6 - 1) {
                *pOVar8 = *pOVar9;
                pOVar9 = pOVar9 + uVar7;
                pOVar8 = pOVar8 + uVar10;
              }
            }
            else if ((buf_col_stride == 8) && (7 < uVar3)) {
              if (uVar2 != 0) {
                uVar6 = 0;
                do {
                  uVar12 = 0;
                  if ((ulong)(uVar3 & 0xfffffffc) != 0) {
                    uVar18 = 0;
                    uVar12 = 0;
                    do {
                      pOVar8[uVar12] = pOVar9[uVar18];
                      pOVar8[uVar12 + 1] = pOVar9[uVar18 + 8 & 0xffffffe8];
                      pOVar8[uVar12 + 2] = pOVar9[uVar18 + 0x10];
                      pOVar8[uVar12 + 3] = pOVar9[uVar18 + 0x18];
                      uVar12 = uVar12 + 4;
                      uVar18 = uVar18 + 0x20;
                    } while (uVar12 < (uVar3 & 0xfffffffc));
                  }
                  if ((uint)uVar12 < uVar3) {
                    uVar12 = uVar12 & 0xffffffff;
                    uVar16 = uVar12 * 8;
                    do {
                      pOVar8[uVar12] = pOVar9[uVar16 & 0xffffffff];
                      uVar12 = uVar12 + 1;
                      uVar16 = uVar16 + 8;
                    } while (uVar15 != uVar12);
                  }
                  pOVar9 = pOVar9 + uVar7;
                  uVar6 = uVar6 + 1;
                  pOVar8 = pOVar8 + uVar10;
                } while (uVar6 != uVar2);
              }
            }
            else if (uVar2 != 0) {
              uVar6 = 0;
              do {
                if (uVar3 != 0) {
                  uVar18 = 0;
                  uVar12 = 0;
                  do {
                    pOVar8[uVar12] = pOVar9[uVar18];
                    uVar12 = uVar12 + 1;
                    uVar18 = uVar18 + buf_col_stride;
                  } while (uVar15 != uVar12);
                }
                pOVar9 = pOVar9 + uVar7;
                uVar6 = uVar6 + 1;
                pOVar8 = pOVar8 + uVar10;
              } while (uVar6 != uVar2);
            }
          }
        }
        else if (pOVar8 == (OPJ_INT32 *)0x0) {
          if (buf_col_stride == 1) {
            if (uVar2 != 0) {
              pOVar8 = buf + lVar11 + (ulong)uVar18;
              uVar6 = uVar2;
              do {
                memset(pOVar8,0,uVar15 << 2);
                pOVar8 = pOVar8 + uVar7;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
          }
          else if (uVar2 != 0) {
            pOVar8 = buf + lVar11 + (ulong)(uVar18 * buf_col_stride);
            uVar6 = 0;
            do {
              if (uVar3 != 0) {
                uVar18 = 0;
                uVar12 = uVar15;
                do {
                  pOVar8[uVar18] = 0;
                  uVar18 = uVar18 + buf_col_stride;
                  uVar12 = uVar12 - 1;
                } while (uVar12 != 0);
              }
              pOVar8 = pOVar8 + uVar7;
              uVar6 = uVar6 + 1;
            } while (uVar6 != uVar2);
          }
        }
        else {
          pOVar8 = pOVar8 + lVar19 + (ulong)(uVar1 - uVar6);
          if (buf_col_stride == 1) {
            pOVar9 = buf + lVar11 + (ulong)uVar18;
            uVar6 = uVar2;
            if (uVar3 == 4) {
              for (; uVar6 != 0; uVar6 = uVar6 - 1) {
                uVar5 = *(undefined8 *)(pOVar8 + 2);
                *(undefined8 *)pOVar9 = *(undefined8 *)pOVar8;
                *(undefined8 *)(pOVar9 + 2) = uVar5;
                pOVar9 = pOVar9 + uVar7;
                pOVar8 = pOVar8 + uVar10;
              }
            }
            else if (uVar2 != 0) {
              do {
                memcpy(pOVar9,pOVar8,uVar15 << 2);
                pOVar9 = pOVar9 + uVar7;
                pOVar8 = pOVar8 + uVar10;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
          }
          else {
            pOVar9 = buf + lVar11 + (ulong)(uVar18 * buf_col_stride);
            uVar6 = uVar2;
            if (uVar3 == 1) {
              for (; uVar6 != 0; uVar6 = uVar6 - 1) {
                *pOVar9 = *pOVar8;
                pOVar9 = pOVar9 + uVar7;
                pOVar8 = pOVar8 + uVar10;
              }
            }
            else if (uVar2 == 1 && buf_col_stride == 2) {
              if ((uVar3 & 0xfffffffc) == 0) {
                uVar12 = 0;
              }
              else {
                uVar16 = 4;
                uVar12 = 0;
                do {
                  iVar4 = (int)uVar16;
                  pOVar9[iVar4 - 4U & 0xfffffff8] = *(OPJ_INT32 *)((long)pOVar8 + uVar16 * 2 + -8);
                  pOVar9[iVar4 - 2U & 0xfffffffa] = *(OPJ_INT32 *)((long)pOVar8 + uVar16 * 2 + -4);
                  pOVar9[uVar16 & 0xffffffff] = *(OPJ_INT32 *)((long)pOVar8 + uVar16 * 2);
                  pOVar9[iVar4 + 2] = *(OPJ_INT32 *)((long)pOVar8 + uVar16 * 2 + 4);
                  uVar12 = uVar12 + 4;
                  uVar16 = uVar16 + 8;
                } while (uVar12 < (uVar3 & 0xfffffffc));
              }
              if ((uint)uVar12 < uVar3) {
                lVar14 = uVar15 - (uVar12 & 0xffffffff);
                uVar15 = (uVar12 & 0xffffffff) * 2;
                do {
                  pOVar9[uVar15 & 0xffffffff] = *(OPJ_INT32 *)((long)pOVar8 + uVar15 * 2);
                  uVar15 = uVar15 + 2;
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
              }
            }
            else if ((buf_col_stride == 8) && (7 < uVar3)) {
              if (uVar2 != 0) {
                uVar6 = 0;
                do {
                  uVar12 = 0;
                  if ((ulong)(uVar3 & 0xfffffffc) != 0) {
                    uVar18 = 0;
                    uVar12 = 0;
                    do {
                      pOVar9[uVar18] = pOVar8[uVar12];
                      pOVar9[uVar18 + 8 & 0xffffffe8] = pOVar8[uVar12 + 1];
                      pOVar9[uVar18 + 0x10] = pOVar8[uVar12 + 2];
                      pOVar9[uVar18 + 0x18] = pOVar8[uVar12 + 3];
                      uVar12 = uVar12 + 4;
                      uVar18 = uVar18 + 0x20;
                    } while (uVar12 < (uVar3 & 0xfffffffc));
                  }
                  if ((uint)uVar12 < uVar3) {
                    uVar12 = uVar12 & 0xffffffff;
                    uVar16 = uVar12 * 8;
                    do {
                      pOVar9[uVar16 & 0xffffffff] = pOVar8[uVar12];
                      uVar12 = uVar12 + 1;
                      uVar16 = uVar16 + 8;
                    } while (uVar15 != uVar12);
                  }
                  pOVar9 = pOVar9 + uVar7;
                  uVar6 = uVar6 + 1;
                  pOVar8 = pOVar8 + uVar10;
                } while (uVar6 != uVar2);
              }
            }
            else if (uVar2 != 0) {
              uVar6 = 0;
              do {
                if (uVar3 != 0) {
                  uVar18 = 0;
                  uVar12 = 0;
                  do {
                    pOVar9[uVar18] = pOVar8[uVar12];
                    uVar12 = uVar12 + 1;
                    uVar18 = uVar18 + buf_col_stride;
                  } while (uVar15 != uVar12);
                }
                pOVar9 = pOVar9 + uVar7;
                uVar6 = uVar6 + 1;
                pOVar8 = pOVar8 + uVar10;
              } while (uVar6 != uVar2);
            }
          }
        }
        uVar20 = uVar20 + 1;
        OVar13 = OVar13 + uVar3;
      } while (OVar13 < x1);
      local_9c = local_9c + 1;
      OVar17 = OVar17 + uVar2;
    } while (OVar17 < y1);
    forgiving = 1;
  }
  return forgiving;
}

Assistant:

static OPJ_BOOL opj_sparse_array_int32_read_or_write(
    const opj_sparse_array_int32_t* sa,
    OPJ_UINT32 x0,
    OPJ_UINT32 y0,
    OPJ_UINT32 x1,
    OPJ_UINT32 y1,
    OPJ_INT32* buf,
    OPJ_UINT32 buf_col_stride,
    OPJ_UINT32 buf_line_stride,
    OPJ_BOOL forgiving,
    OPJ_BOOL is_read_op)
{
    OPJ_UINT32 y, block_y;
    OPJ_UINT32 y_incr = 0;
    const OPJ_UINT32 block_width = sa->block_width;

    if (!opj_sparse_array_is_region_valid(sa, x0, y0, x1, y1)) {
        return forgiving;
    }

    block_y = y0 / sa->block_height;
    for (y = y0; y < y1; block_y ++, y += y_incr) {
        OPJ_UINT32 x, block_x;
        OPJ_UINT32 x_incr = 0;
        OPJ_UINT32 block_y_offset;
        y_incr = (y == y0) ? sa->block_height - (y0 % sa->block_height) :
                 sa->block_height;
        block_y_offset = sa->block_height - y_incr;
        y_incr = opj_uint_min(y_incr, y1 - y);
        block_x = x0 / block_width;
        for (x = x0; x < x1; block_x ++, x += x_incr) {
            OPJ_UINT32 j;
            OPJ_UINT32 block_x_offset;
            OPJ_INT32* src_block;
            x_incr = (x == x0) ? block_width - (x0 % block_width) : block_width;
            block_x_offset = block_width - x_incr;
            x_incr = opj_uint_min(x_incr, x1 - x);
            src_block = sa->data_blocks[block_y * sa->block_count_hor + block_x];
            if (is_read_op) {
                if (src_block == NULL) {
                    if (buf_col_stride == 1) {
                        OPJ_INT32* dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride +
                                              (x - x0) * buf_col_stride;
                        for (j = 0; j < y_incr; j++) {
                            memset(dest_ptr, 0, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += buf_line_stride;
                        }
                    } else {
                        OPJ_INT32* dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride +
                                              (x - x0) * buf_col_stride;
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < x_incr; k++) {
                                dest_ptr[k * buf_col_stride] = 0;
                            }
                            dest_ptr += buf_line_stride;
                        }
                    }
                } else {
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = src_block + block_y_offset *
                                                            (OPJ_SIZE_T)block_width + block_x_offset;
                    if (buf_col_stride == 1) {
                        OPJ_INT32* OPJ_RESTRICT dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride
                                                           +
                                                           (x - x0) * buf_col_stride;
                        if (x_incr == 4) {
                            /* Same code as general branch, but the compiler */
                            /* can have an efficient memcpy() */
                            (void)(x_incr); /* trick to silent cppcheck duplicateBranch warning */
                            for (j = 0; j < y_incr; j++) {
                                memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else {
                            for (j = 0; j < y_incr; j++) {
                                memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        }
                    } else {
                        OPJ_INT32* OPJ_RESTRICT dest_ptr = buf + (y - y0) * (OPJ_SIZE_T)buf_line_stride
                                                           +
                                                           (x - x0) * buf_col_stride;
                        if (x_incr == 1) {
                            for (j = 0; j < y_incr; j++) {
                                *dest_ptr = *src_ptr;
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else if (y_incr == 1 && buf_col_stride == 2) {
                            OPJ_UINT32 k;
                            for (k = 0; k < (x_incr & ~3U); k += 4) {
                                dest_ptr[k * buf_col_stride] = src_ptr[k];
                                dest_ptr[(k + 1) * buf_col_stride] = src_ptr[k + 1];
                                dest_ptr[(k + 2) * buf_col_stride] = src_ptr[k + 2];
                                dest_ptr[(k + 3) * buf_col_stride] = src_ptr[k + 3];
                            }
                            for (; k < x_incr; k++) {
                                dest_ptr[k * buf_col_stride] = src_ptr[k];
                            }
                        } else if (x_incr >= 8 && buf_col_stride == 8) {
                            for (j = 0; j < y_incr; j++) {
                                OPJ_UINT32 k;
                                for (k = 0; k < (x_incr & ~3U); k += 4) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                    dest_ptr[(k + 1) * buf_col_stride] = src_ptr[k + 1];
                                    dest_ptr[(k + 2) * buf_col_stride] = src_ptr[k + 2];
                                    dest_ptr[(k + 3) * buf_col_stride] = src_ptr[k + 3];
                                }
                                for (; k < x_incr; k++) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                }
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        } else {
                            /* General case */
                            for (j = 0; j < y_incr; j++) {
                                OPJ_UINT32 k;
                                for (k = 0; k < x_incr; k++) {
                                    dest_ptr[k * buf_col_stride] = src_ptr[k];
                                }
                                dest_ptr += buf_line_stride;
                                src_ptr += block_width;
                            }
                        }
                    }
                }
            } else {
                if (src_block == NULL) {
                    src_block = (OPJ_INT32*) opj_calloc(1,
                                                        sa->block_width * sa->block_height * sizeof(OPJ_INT32));
                    if (src_block == NULL) {
                        return OPJ_FALSE;
                    }
                    sa->data_blocks[block_y * sa->block_count_hor + block_x] = src_block;
                }

                if (buf_col_stride == 1) {
                    OPJ_INT32* OPJ_RESTRICT dest_ptr = src_block + block_y_offset *
                                                       (OPJ_SIZE_T)block_width + block_x_offset;
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = buf + (y - y0) *
                                                            (OPJ_SIZE_T)buf_line_stride + (x - x0) * buf_col_stride;
                    if (x_incr == 4) {
                        /* Same code as general branch, but the compiler */
                        /* can have an efficient memcpy() */
                        (void)(x_incr); /* trick to silent cppcheck duplicateBranch warning */
                        for (j = 0; j < y_incr; j++) {
                            memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += block_width;
                            src_ptr += buf_line_stride;
                        }
                    } else {
                        for (j = 0; j < y_incr; j++) {
                            memcpy(dest_ptr, src_ptr, sizeof(OPJ_INT32) * x_incr);
                            dest_ptr += block_width;
                            src_ptr += buf_line_stride;
                        }
                    }
                } else {
                    OPJ_INT32* OPJ_RESTRICT dest_ptr = src_block + block_y_offset *
                                                       (OPJ_SIZE_T)block_width + block_x_offset;
                    const OPJ_INT32* OPJ_RESTRICT src_ptr = buf + (y - y0) *
                                                            (OPJ_SIZE_T)buf_line_stride + (x - x0) * buf_col_stride;
                    if (x_incr == 1) {
                        for (j = 0; j < y_incr; j++) {
                            *dest_ptr = *src_ptr;
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    } else if (x_incr >= 8 && buf_col_stride == 8) {
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < (x_incr & ~3U); k += 4) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                                dest_ptr[k + 1] = src_ptr[(k + 1) * buf_col_stride];
                                dest_ptr[k + 2] = src_ptr[(k + 2) * buf_col_stride];
                                dest_ptr[k + 3] = src_ptr[(k + 3) * buf_col_stride];
                            }
                            for (; k < x_incr; k++) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                            }
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    } else {
                        /* General case */
                        for (j = 0; j < y_incr; j++) {
                            OPJ_UINT32 k;
                            for (k = 0; k < x_incr; k++) {
                                dest_ptr[k] = src_ptr[k * buf_col_stride];
                            }
                            src_ptr += buf_line_stride;
                            dest_ptr += block_width;
                        }
                    }
                }
            }
        }
    }

    return OPJ_TRUE;
}